

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontGlyph_resize(ImVector_ImFontGlyph *self,int new_size)

{
  int new_size_local;
  ImVector_ImFontGlyph *self_local;
  
  ImVector<ImFontGlyph>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_resize(ImVector_ImFontGlyph* self,int new_size)
{
    return self->resize(new_size);
}